

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall SSTable::writeToDisk(SSTable *this,path *dst_file)

{
  pointer pSVar1;
  pointer pSVar2;
  SSTableDataEntry *item;
  pointer s;
  pointer s_00;
  ofstream os;
  path apStack_228 [12];
  
  create_binary_ofstream(apStack_228);
  operator<<((ofstream *)apStack_228,this->header);
  pSVar1 = (this->data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (s = (this->data->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
           _M_impl.super__Vector_impl_data._M_start; s != pSVar1; s = s + 1) {
    operator<<((ofstream *)apStack_228,s);
  }
  pSVar2 = (this->index->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (s_00 = (this->index->super__Vector_base<SSTableIndexItem,_std::allocator<SSTableIndexItem>_>)
              ._M_impl.super__Vector_impl_data._M_start; s_00 != pSVar2; s_00 = s_00 + 1) {
    operator<<((ofstream *)apStack_228,s_00);
  }
  std::ostream::flush();
  std::ofstream::close();
  std::filesystem::__cxx11::path::operator=(&this->file,dst_file);
  std::ofstream::~ofstream(apStack_228);
  return;
}

Assistant:

void SSTable::writeToDisk(const path &dst_file) {
    auto os = create_binary_ofstream(dst_file);
    os << *header;
    for (const auto &item:*data) {
        os << item;
    }
    for (const auto &item:*index) {
        os << item;
    }
    os.flush();
    os.close();
    file = dst_file; // Make connection between SSTable object and disk file.
}